

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
     ::Load(istream *in,
           basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *object)

{
  size_t i;
  ulong uVar1;
  uint local_30;
  wchar_t local_2c;
  uint32_t size;
  wchar_t obj;
  
  std::istream::read((char *)in,(long)&local_30);
  object->_M_string_length = 0;
  *(object->_M_dataplus)._M_p = L'\0';
  std::__cxx11::wstring::reserve((ulong)object);
  for (uVar1 = 0; uVar1 < local_30; uVar1 = uVar1 + 1) {
    TPodSerializer<wchar_t>::Load(in,&local_2c);
    std::__cxx11::wstring::push_back((wchar_t)object);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }